

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O1

int reinstall_initial_encryption(quicly_conn_t *conn,int err_code_if_unknown_version)

{
  uint32_t uVar1;
  st_quicly_handshake_space_t *psVar2;
  ptls_iovec_t salt;
  ptls_cipher_suite_t *cs;
  undefined1 *puVar3;
  uint8_t *puVar4;
  ptls_iovec_t cid;
  
  uVar1 = (conn->super).version;
  puVar3 = (uint8_t *)0x0;
  if (uVar1 == 0xff00001b) {
    puVar3 = get_salt_draft27;
  }
  puVar4 = get_salt_current;
  if (uVar1 != 0xff00001d) {
    puVar4 = puVar3;
  }
  if (puVar4 != (uint8_t *)0x0) {
    psVar2 = conn->initial;
    ptls_aead_free((psVar2->cipher).ingress.aead);
    ptls_cipher_free((psVar2->cipher).ingress.header_protection);
    psVar2 = conn->initial;
    ptls_aead_free((psVar2->cipher).egress.aead);
    ptls_cipher_free((psVar2->cipher).egress.header_protection);
    cs = get_aes128gcmsha256((conn->super).ctx);
    salt.len = 0x14;
    salt.base = puVar4;
    cid.len._0_1_ = (conn->super).remote.cid_set.cids[0].cid.len;
    cid.base = (conn->super).remote.cid_set.cids[0].cid.cid;
    cid.len._1_7_ = 0;
    err_code_if_unknown_version =
         setup_initial_encryption
                   (cs,&(conn->initial->cipher).ingress,&(conn->initial->cipher).egress,cid,1,salt,
                    (quicly_conn_t *)0x0);
  }
  return err_code_if_unknown_version;
}

Assistant:

static int reinstall_initial_encryption(quicly_conn_t *conn, int err_code_if_unknown_version)
{
    const struct st_ptls_salt_t *salt;

    /* get salt */
    if ((salt = get_salt(conn->super.version)) == NULL)
        return err_code_if_unknown_version;

    /* dispose existing context */
    dispose_cipher(&conn->initial->cipher.ingress);
    dispose_cipher(&conn->initial->cipher.egress);

    /* setup encryption context */
    return setup_initial_encryption(
        get_aes128gcmsha256(conn->super.ctx), &conn->initial->cipher.ingress, &conn->initial->cipher.egress,
        ptls_iovec_init(conn->super.remote.cid_set.cids[0].cid.cid, conn->super.remote.cid_set.cids[0].cid.len), 1,
        ptls_iovec_init(salt->initial, sizeof(salt->initial)), NULL);
}